

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O3

bool __thiscall USDFParser::ParseConversation(USDFParser *this)

{
  FStrifeDialogueNode **ppFVar1;
  uint dlgindex;
  bool bVar2;
  int convid;
  undefined8 in_RAX;
  ulong uVar3;
  PClassActor *Class;
  ulong uVar4;
  char *key_00;
  bool block;
  FName key;
  undefined1 auStack_38 [8];
  
  dlgindex = StrifeDialogues.Count;
  uVar4 = (ulong)StrifeDialogues.Count;
  auStack_38 = (undefined1  [8])in_RAX;
  bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
  convid = -1;
  Class = (PClassActor *)0x0;
  if (!bVar2) {
    convid = -1;
    do {
      auStack_38[3] = 0;
      UDMFParserBase::ParseKey((UDMFParserBase *)(auStack_38 + 4),SUB81(this,0),(bool *)0x1);
      if (auStack_38[3] == '\0') {
        if (auStack_38._4_4_ == 0x11f) {
          if ((this->super_UDMFParserBase).namespace_bits == 1) {
            key_00 = FName::NameData.NameArray[0x11f].Text;
LAB_0046499f:
            convid = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,key_00);
          }
        }
        else if ((auStack_38._4_4_ == 4) &&
                (Class = CheckActorType(this,FName::NameData.NameArray[4].Text),
                (this->super_UDMFParserBase).namespace_bits == 2)) {
          key_00 = FName::NameData.NameArray[(int)auStack_38._4_4_].Text;
          goto LAB_0046499f;
        }
      }
      else if (auStack_38._4_4_ == 0x1e8) {
        bVar2 = ParsePage(this);
        if (!bVar2) {
          return false;
        }
      }
      else {
        FScanner::UnGet((FScanner *)this);
        UDMFParserBase::Skip(&this->super_UDMFParserBase);
      }
      bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
    } while (!bVar2);
    if ((Class == (PClassActor *)0x0) && (convid == 0)) {
      FScanner::ScriptMessage((FScanner *)this,"No valid actor type defined in conversation.");
      return false;
    }
  }
  SetConversation(convid,Class,dlgindex);
  ppFVar1 = StrifeDialogues.Array;
  uVar3 = (ulong)StrifeDialogues.Count;
  if (dlgindex < StrifeDialogues.Count) {
    do {
      ppFVar1[uVar4]->SpeakerType = Class;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return true;
}

Assistant:

bool ParseConversation()
	{
		PClassActor *type = NULL;
		int dlgid = -1;
		unsigned int startpos = StrifeDialogues.Size();

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Actor:
					type = CheckActorType(key);
					if (namespace_bits == St)
					{
						dlgid = CheckInt(key);
					}
					break;

				case NAME_Id:
					if (namespace_bits == Zd)
					{
						dlgid = CheckInt(key);
					}
					break;
				}
			}
			else
			{
				switch(key)
				{
				case NAME_Page:
					if (!ParsePage()) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		if (type == NULL && dlgid == 0)
		{
			sc.ScriptMessage("No valid actor type defined in conversation.");
			return false;
		}
		SetConversation(dlgid, type, startpos);
		for(;startpos < StrifeDialogues.Size(); startpos++)
		{
			StrifeDialogues[startpos]->SpeakerType = type;
		}
		return true;
	}